

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDREFDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::IDREFDatatypeValidator::checkValueSpace
          (IDREFDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  bool bVar1;
  XMLSize_t count;
  InvalidDatatypeValueException *this_00;
  MemoryManager *manager_local;
  XMLCh *content_local;
  IDREFDatatypeValidator *this_local;
  
  count = XMLString::stringLen(content);
  bVar1 = XMLChar1_0::isValidNCName(content,count);
  if (!bVar1) {
    this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeValueException::InvalidDatatypeValueException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/IDREFDatatypeValidator.cpp"
               ,0x69,VALUE_Invalid_NCName,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    __cxa_throw(this_00,&InvalidDatatypeValueException::typeinfo,
                InvalidDatatypeValueException::~InvalidDatatypeValueException);
  }
  return;
}

Assistant:

void IDREFDatatypeValidator::checkValueSpace(const XMLCh* const content
                                             , MemoryManager* const manager)
{
    //
    // 3.3.9 check must: "NCName"
    //
    if ( !XMLChar1_0::isValidNCName(content, XMLString::stringLen(content)) )
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                , XMLExcepts::VALUE_Invalid_NCName
                , content
                , manager);
    }

}